

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O1

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
write_to_file(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,char *filename)

{
  pointer pdVar1;
  ostream *poVar2;
  long lVar3;
  ofstream out;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220);
  std::ofstream::open((char *)&local_220,(_Ios_Openmode)filename);
  pdVar1 = (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl
      .super__Vector_impl_data._M_finish != pdVar1) {
    lVar3 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>(pdVar1[lVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar3 = lVar3 + 1;
      pdVar1 = (this->sorted_vector_of_distances).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
    } while (lVar3 != (long)(this->sorted_vector_of_distances).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
  }
  std::ofstream::close();
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void Vector_distances_in_diagram<F>::write_to_file(const char* filename) const {
  std::ofstream out;
  out.open(filename);

  for (size_t i = 0; i != this->sorted_vector_of_distances.size(); ++i) {
    out << this->sorted_vector_of_distances[i] << " ";
  }

  out.close();
}